

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O0

void __thiscall
BackwardPass::VerifyByteCodeUpwardExposed
          (BackwardPass *this,BasicBlock *block,Func *func,
          BVSparse<Memory::JitArenaAllocator> *trackingByteCodeUpwardExposedUsed,Instr *instr,
          uint32 bytecodeOffset)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  undefined4 *puVar4;
  BVSparse<Memory::JitArenaAllocator> *bv;
  BVSparse<Memory::JitArenaAllocator> *this_00;
  BVUnitT<unsigned_long> local_68;
  SparseBVUnit _unit;
  BVIndex _startIndex;
  BVIndex _offset;
  BVSparseNode<Memory::JitArenaAllocator> *_curNode;
  BVIndex bytecodeReg;
  BVSparse<Memory::JitArenaAllocator> *notInDeadStore;
  BVSparse<Memory::JitArenaAllocator> *byteCodeUpwardExposedUsed;
  uint32 bytecodeOffset_local;
  Instr *instr_local;
  BVSparse<Memory::JitArenaAllocator> *trackingByteCodeUpwardExposedUsed_local;
  Func *func_local;
  BasicBlock *block_local;
  BackwardPass *this_local;
  
  if (instr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x22cf,"(instr)","instr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  if (bytecodeOffset == 0xffffffff) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x22d0,"(bytecodeOffset != Js::Constants::NoByteCodeOffset)",
                       "bytecodeOffset != Js::Constants::NoByteCodeOffset");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  if (this->tag != DeadStorePhase) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x22d1,"(this->tag == Js::DeadStorePhase)","this->tag == Js::DeadStorePhase"
                      );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  if (((trackingByteCodeUpwardExposedUsed != (BVSparse<Memory::JitArenaAllocator> *)0x0) &&
      (bVar2 = BVSparse<Memory::JitArenaAllocator>::IsEmpty(trackingByteCodeUpwardExposedUsed),
      !bVar2)) && ((*(uint *)&this->func->field_0x240 >> 4 & 1) != 0)) {
    bv = GetByteCodeRegisterUpwardExposed(this,block,func,this->tempAlloc);
    this_00 = BVSparse<Memory::JitArenaAllocator>::MinusNew
                        (trackingByteCodeUpwardExposedUsed,bv,this->tempAlloc);
    bVar2 = BVSparse<Memory::JitArenaAllocator>::IsEmpty(this_00);
    if (!bVar2) {
      Output::Print(L"\n\nByteCode Updward Exposed mismatch after DeadStore\n");
      Output::Print(L"Mismatch Instr:\n");
      IR::Instr::Dump(instr);
      Output::Print(
                   L"  ByteCode Register list present before Backward pass missing in DeadStore pass:\n"
                   );
      for (__startIndex = this_00->head; __startIndex != (Type_conflict)0x0;
          __startIndex = __startIndex->next) {
        _unit.word._0_4_ = __startIndex->startIndex;
        local_68.word = (__startIndex->data).word;
        _unit.word._4_4_ = BVUnitT<unsigned_long>::GetNextBit(&local_68);
        while (_unit.word._4_4_ != 0xffffffff) {
          uVar3 = (Type)_unit.word + _unit.word._4_4_;
          BVUnitT<unsigned_long>::Clear(&local_68,_unit.word._4_4_);
          Output::Print(L"    R%u\n",(ulong)uVar3);
          _unit.word._4_4_ = BVUnitT<unsigned_long>::GetNextBit(&local_68);
        }
        if (__startIndex == (Type_conflict)0x0) break;
      }
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                         ,0x22e8,"(false)","ByteCode Updward Exposed Used Mismatch");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    Memory::
    DeleteObject<Memory::JitArenaAllocator,(Memory::AllocatorDeleteFlags)0,BVSparse<Memory::JitArenaAllocator>>
              (this->tempAlloc,this_00);
    Memory::
    DeleteObject<Memory::JitArenaAllocator,(Memory::AllocatorDeleteFlags)0,BVSparse<Memory::JitArenaAllocator>>
              (this->tempAlloc,bv);
  }
  return;
}

Assistant:

void
BackwardPass::VerifyByteCodeUpwardExposed(BasicBlock* block, Func* func, BVSparse<JitArenaAllocator>* trackingByteCodeUpwardExposedUsed, IR::Instr* instr, uint32 bytecodeOffset)
{
    Assert(instr);
    Assert(bytecodeOffset != Js::Constants::NoByteCodeOffset);
    Assert(this->tag == Js::DeadStorePhase);

    // The calculated bytecode upward exposed should be the same between Backward and DeadStore passes
    if (trackingByteCodeUpwardExposedUsed && !trackingByteCodeUpwardExposedUsed->IsEmpty())
    {
        // We don't need to track bytecodeUpwardExposeUses if we don't have bailout
        // We've collected the Backward bytecodeUpwardExposeUses for nothing, oh well.
        if (this->func->hasBailout)
        {
            BVSparse<JitArenaAllocator>* byteCodeUpwardExposedUsed = GetByteCodeRegisterUpwardExposed(block, func, this->tempAlloc);
            BVSparse<JitArenaAllocator>* notInDeadStore = trackingByteCodeUpwardExposedUsed->MinusNew(byteCodeUpwardExposedUsed, this->tempAlloc);

            if (!notInDeadStore->IsEmpty())
            {
                Output::Print(_u("\n\nByteCode Updward Exposed mismatch after DeadStore\n"));
                Output::Print(_u("Mismatch Instr:\n"));
                instr->Dump();
                Output::Print(_u("  ByteCode Register list present before Backward pass missing in DeadStore pass:\n"));
                FOREACH_BITSET_IN_SPARSEBV(bytecodeReg, notInDeadStore)
                {
                    Output::Print(_u("    R%u\n"), bytecodeReg);
                }
                NEXT_BITSET_IN_SPARSEBV;
                AssertMsg(false, "ByteCode Updward Exposed Used Mismatch");
            }
            JitAdelete(this->tempAlloc, notInDeadStore);
            JitAdelete(this->tempAlloc, byteCodeUpwardExposedUsed);
        }
    }
}